

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O3

void __thiscall AActor::RestoreSpecialPosition(AActor *this)

{
  double dVar1;
  sector_t *psVar2;
  double dVar3;
  double dVar4;
  int iVar5;
  uint uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  FLinkContext ctx;
  FLinkContext local_28;
  
  local_28.sector_list = (msecnode_t *)0x0;
  local_28.render_list = (msecnode_t *)0x0;
  dVar3 = (this->SpawnPoint).X;
  dVar1 = (this->SpawnPoint).Y;
  UnlinkFromWorld(this,&local_28);
  (this->__Pos).X = dVar3;
  (this->__Pos).Y = dVar1;
  LinkToWorld(this,&local_28,true,(sector_t *)0x0);
  psVar2 = this->Sector;
  (this->__Pos).Z =
       (dVar1 * (psVar2->floorplane).normal.Y +
       (psVar2->floorplane).normal.X * dVar3 + (psVar2->floorplane).D) * (psVar2->floorplane).negiC;
  P_FindFloorCeiling(this,0x11);
  if (((this->flags).Value & 0x100) == 0) {
    if (((this->flags2).Value & 0x40) == 0) {
      dVar3 = (this->SpawnPoint).Z + this->floorz;
    }
    else {
      dVar3 = this->floorz;
      dVar1 = (this->ceilingz - this->Height) - dVar3;
      if (48.0 < dVar1) {
        uVar6 = FRandom::GenRand32(&pr_restore);
        dVar3 = (double)(uVar6 & 0xff) * (dVar1 + -40.0) * 0.00390625 + this->floorz + 40.0;
      }
    }
  }
  else {
    dVar3 = (this->ceilingz - this->Height) - (this->SpawnPoint).Z;
  }
  (this->__Pos).Z = dVar3;
  P_FindFloorCeiling(this,0xe);
  dVar3 = (this->__Pos).Z;
  dVar1 = this->floorz;
  uVar7 = SUB84(dVar3,0);
  uVar8 = (int)((ulong)dVar3 >> 0x20);
  if (dVar3 < dVar1) {
    (this->__Pos).Z = dVar1;
    uVar7 = SUB84(dVar1,0);
    uVar8 = (int)((ulong)dVar1 >> 0x20);
  }
  dVar3 = (double)CONCAT44(uVar8,uVar7);
  if (((this->flags).Value & 2) != 0) {
    dVar3 = (double)CONCAT44(uVar8,uVar7);
    if (this->ceilingz < (double)CONCAT44(uVar8,uVar7) + this->Height) {
      dVar3 = this->ceilingz - this->Height;
      (this->__Pos).Z = dVar3;
    }
  }
  (this->Prev).Z = dVar3;
  dVar3 = (this->__Pos).Y;
  dVar1 = (this->Angles).Pitch.Degrees;
  dVar4 = (this->Angles).Yaw.Degrees;
  (this->Prev).X = (this->__Pos).X;
  (this->Prev).Y = dVar3;
  (this->PrevAngles).Roll.Degrees = (this->Angles).Roll.Degrees;
  (this->PrevAngles).Pitch.Degrees = dVar1;
  (this->PrevAngles).Yaw.Degrees = dVar4;
  if (this->Sector == (sector_t *)0x0) {
    iVar5 = 0;
  }
  else {
    iVar5 = this->Sector->PortalGroup;
  }
  this->PrevPortalGroup = iVar5;
  return;
}

Assistant:

void AActor::RestoreSpecialPosition()
{
	// Move item back to its original location
	DVector2 sp = SpawnPoint;

	FLinkContext ctx;
	UnlinkFromWorld(&ctx);
	SetXY(sp);
	LinkToWorld(&ctx, true);
	SetZ(Sector->floorplane.ZatPoint(sp));
	P_FindFloorCeiling(this, FFCF_ONLYSPAWNPOS | FFCF_NOPORTALS);	// no portal checks here so that things get spawned in this sector.

	if (flags & MF_SPAWNCEILING)
	{
		SetZ(ceilingz - Height - SpawnPoint.Z);
	}
	else if (flags2 & MF2_SPAWNFLOAT)
	{
		double space = ceilingz - Height - floorz;
		if (space > 48)
		{
			space -= 40;
			SetZ((space * pr_restore()) / 256. + floorz + 40);
		}
		else
		{
			SetZ(floorz);
		}
	}
	else
	{
		SetZ(SpawnPoint.Z + floorz);
	}
	// Redo floor/ceiling check, in case of 3D floors and portals
	P_FindFloorCeiling(this, FFCF_SAMESECTOR | FFCF_ONLY3DFLOORS | FFCF_3DRESTRICT);
	if (Z() < floorz)
	{ // Do not reappear under the floor, even if that's where we were for the
	  // initial spawn.
		SetZ(floorz);
	}
	if ((flags & MF_SOLID) && (Top() > ceilingz))
	{ // Do the same for the ceiling.
		SetZ(ceilingz - Height);
	}
	// Do not interpolate from the position the actor was at when it was
	// picked up, in case that is different from where it is now.
	ClearInterpolation();
}